

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_init.c
# Opt level: O0

int ares_query_timeout_cmp_cb(void *arg1,void *arg2)

{
  ares_query_t *q2;
  ares_query_t *q1;
  void *arg2_local;
  void *arg1_local;
  
  if (*(long *)((long)arg2 + 0x18) < *(long *)((long)arg1 + 0x18)) {
    arg1_local._4_4_ = 1;
  }
  else if (*(long *)((long)arg1 + 0x18) < *(long *)((long)arg2 + 0x18)) {
    arg1_local._4_4_ = -1;
  }
  else if (*(uint *)((long)arg2 + 0x20) < *(uint *)((long)arg1 + 0x20)) {
    arg1_local._4_4_ = 1;
  }
  else if (*(uint *)((long)arg1 + 0x20) < *(uint *)((long)arg2 + 0x20)) {
    arg1_local._4_4_ = -1;
  }
  else {
    arg1_local._4_4_ = 0;
  }
  return arg1_local._4_4_;
}

Assistant:

static int ares_query_timeout_cmp_cb(const void *arg1, const void *arg2)
{
  const ares_query_t *q1 = arg1;
  const ares_query_t *q2 = arg2;

  if (q1->timeout.sec > q2->timeout.sec) {
    return 1;
  }
  if (q1->timeout.sec < q2->timeout.sec) {
    return -1;
  }

  if (q1->timeout.usec > q2->timeout.usec) {
    return 1;
  }
  if (q1->timeout.usec < q2->timeout.usec) {
    return -1;
  }

  return 0;
}